

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O3

void __thiscall
BMRS_XZ<TTA>::FindRunsMem
          (BMRS_XZ<TTA> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ulong *puVar2;
  uint64_t *flag_bits;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  unsigned_short uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint64_t uVar12;
  uint uVar13;
  Run *pRVar14;
  ulong *puVar15;
  Run *pRVar16;
  unsigned_short uVar17;
  uint end;
  ulong uVar18;
  Run *pRVar19;
  long lVar20;
  short sVar21;
  ulong uVar22;
  uint local_9c;
  
  lVar11 = (long)data_width;
  uVar18 = *bits_start;
  sVar21 = 0;
  puVar15 = bits_start;
  pRVar19 = runs;
  while( true ) {
    for (; uVar18 != 0; uVar18 = (~uVar18 >> ((byte)lVar5 & 0x3f)) << ((byte)lVar5 & 0x3f)) {
      lVar5 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      pRVar19->start_pos = (short)lVar5 + sVar21;
      uVar18 = (~uVar18 >> ((byte)lVar5 & 0x3f)) << ((byte)lVar5 & 0x3f);
      if (uVar18 == 0) {
        do {
          sVar21 = sVar21 + 0x40;
          puVar1 = puVar15 + 1;
          puVar15 = puVar15 + 1;
        } while (*puVar1 == 0xffffffffffffffff);
        uVar18 = ~*puVar1;
      }
      lVar5 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      pRVar19->end_pos = (short)lVar5 + sVar21;
      uVar9 = TTA::MemNewLabel();
      pRVar19->label = uVar9;
      pRVar19 = pRVar19 + 1;
    }
    puVar15 = puVar15 + 1;
    if (puVar15 == bits_start + lVar11) break;
    sVar21 = sVar21 + 0x40;
    uVar18 = *puVar15;
  }
  pRVar19->start_pos = 0xffff;
  pRVar19->end_pos = 0xffff;
  if (height < 2) {
LAB_002506a7:
    uVar9 = TTA::MemFlatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
    return;
  }
  uVar18 = 1;
LAB_002503f4:
  pRVar14 = pRVar19 + 1;
  flag_bits = bits_flag + (uVar18 - 1) * lVar11;
  puVar15 = bits_start + uVar18 * lVar11;
  puVar1 = puVar15 + lVar11;
  uVar22 = *puVar15;
  lVar5 = 0;
  pRVar19 = pRVar14;
  do {
    for (; uVar22 != 0; uVar22 = ~uVar22 & -1L << ((byte)lVar7 & 0x3f)) {
      lVar6 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      uVar22 = (~uVar22 >> ((byte)lVar6 & 0x3f)) << ((byte)lVar6 & 0x3f);
      lVar20 = lVar5;
      if (uVar22 == 0) {
        do {
          lVar20 = lVar20 + 0x40;
          puVar2 = puVar15 + 1;
          puVar15 = puVar15 + 1;
        } while (*puVar2 == 0xffffffffffffffff);
        uVar22 = ~*puVar2;
      }
      lVar7 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      uVar9 = (uint)(lVar5 + lVar6);
      uVar10 = uVar9 & 0xffff;
      pRVar16 = runs;
      do {
        runs = pRVar16;
        uVar3 = runs->end_pos;
        pRVar16 = runs + 1;
      } while (uVar3 < uVar10);
      uVar4 = runs->start_pos;
      uVar17 = (unsigned_short)(lVar7 + lVar20);
      end = (uint)(lVar7 + lVar20) & 0xffff;
      uVar8 = (unsigned_short)(lVar5 + lVar6);
      if (end < uVar4) {
        pRVar19->start_pos = uVar8;
        pRVar19->end_pos = uVar17;
        uVar9 = TTA::MemNewLabel();
        pRVar19->label = uVar9;
      }
      else {
        uVar13 = (uint)uVar4;
        if (uVar4 <= uVar10) {
          uVar13 = uVar9;
        }
        if (uVar3 < end) {
          uVar12 = is_connected(this,flag_bits,uVar13 & 0xffff,(uint)uVar3);
          if (uVar12 == 0) {
            local_9c = 0;
          }
          else {
            uVar9 = runs->label;
            TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar9] =
                 TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar9] + 1;
            local_9c = TTA::mem_rtable_.vec_.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar9];
          }
          uVar3 = pRVar16->start_pos;
          runs = pRVar16;
          uVar9 = local_9c;
          while (local_9c = uVar9, uVar3 <= end) {
            if (end <= runs->end_pos) {
              uVar12 = is_connected(this,flag_bits,(uint)uVar3,end);
              if (uVar12 != 0) {
                uVar10 = runs->label;
                TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar10] =
                     TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)uVar10] + 1;
                uVar10 = TTA::mem_rtable_.vec_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar10];
                if ((uVar9 != uVar10) && (local_9c = uVar10, uVar9 != 0)) {
                  local_9c = TTA::MemMerge(uVar9,uVar10);
                }
              }
              break;
            }
            uVar12 = is_connected(this,flag_bits,(uint)uVar3,(uint)runs->end_pos);
            if (uVar12 != 0) {
              uVar10 = runs->label;
              TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar10] =
                   TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar10] + 1;
              uVar10 = TTA::mem_rtable_.vec_.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar10];
              if ((uVar9 != uVar10) && (local_9c = uVar10, uVar9 != 0)) {
                local_9c = TTA::MemMerge(uVar9,uVar10);
              }
            }
            pRVar16 = runs + 1;
            runs = runs + 1;
            uVar9 = local_9c;
            uVar3 = pRVar16->start_pos;
          }
          if (local_9c == 0) {
LAB_0025064a:
            local_9c = TTA::MemNewLabel();
          }
        }
        else {
          uVar12 = is_connected(this,flag_bits,uVar13 & 0xffff,end);
          if (uVar12 == 0) goto LAB_0025064a;
          uVar9 = runs->label;
          TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar9] =
               TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar9] + 1;
          local_9c = TTA::mem_rtable_.vec_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar9];
        }
        pRVar19->label = local_9c;
        pRVar19->start_pos = uVar8;
        pRVar19->end_pos = uVar17;
      }
      pRVar19 = pRVar19 + 1;
      lVar5 = lVar20;
    }
    puVar15 = puVar15 + 1;
    if (puVar15 == puVar1) break;
    uVar22 = *puVar15;
    lVar5 = lVar5 + 0x40;
  } while( true );
  pRVar19->start_pos = 0xffff;
  pRVar19->end_pos = 0xffff;
  uVar18 = uVar18 + 1;
  runs = pRVar14;
  if (uVar18 == (uint)height) goto LAB_002506a7;
  goto LAB_002503f4;
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::MemGetLabel(runs_up->label);
                    else runs->label = LabelsSolver::MemNewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::MemGetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::MemNewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }